

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

VOID OutputDebugStringW(LPCWSTR lpOutputString)

{
  int iVar1;
  LPCSTR lpMultiByteStr;
  DWORD dwErrCode;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00149a55;
  if (lpOutputString == (LPCWSTR)0x0) {
    OutputDebugStringA("");
  }
  else {
    iVar1 = WideCharToMultiByte(0,0,lpOutputString,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
    if (iVar1 == 0) {
      fprintf(_stderr,"] %s %s:%d","OutputDebugStringW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/debug/debug.cpp"
              ,0xdc);
      fprintf(_stderr,"failed to get wide chars length\n");
      dwErrCode = 0x54f;
    }
    else {
      lpMultiByteStr = (LPCSTR)CorUnix::InternalMalloc((long)iVar1);
      if (lpMultiByteStr != (LPCSTR)0x0) {
        iVar1 = WideCharToMultiByte(0,0,lpOutputString,-1,lpMultiByteStr,iVar1,(LPCSTR)0x0,
                                    (LPBOOL)0x0);
        if (iVar1 == 0) {
          fprintf(_stderr,"] %s %s:%d","OutputDebugStringW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/debug/debug.cpp"
                  ,0xec);
          fprintf(_stderr,"failed to convert wide chars to multibytes\n");
          SetLastError(0x54f);
        }
        else {
          OutputDebugStringA(lpMultiByteStr);
        }
        CorUnix::InternalFree(lpMultiByteStr);
        goto LAB_00149a41;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00149a55;
      dwErrCode = 8;
    }
    SetLastError(dwErrCode);
  }
LAB_00149a41:
  if (PAL_InitializeChakraCoreCalled != false) {
    return;
  }
LAB_00149a55:
  abort();
}

Assistant:

VOID
PALAPI
OutputDebugStringW(
        IN LPCWSTR lpOutputString)
{
    CHAR *lpOutputStringA;
    int strLen;

    PERF_ENTRY(OutputDebugStringW);
    ENTRY("OutputDebugStringW (lpOutputString=%p (%S))\n",
          lpOutputString ? lpOutputString: W16_NULLSTRING,
          lpOutputString ? lpOutputString: W16_NULLSTRING);

    if (lpOutputString == NULL)
    {
        OutputDebugStringA("");
        goto EXIT;
    }

    if ((strLen = WideCharToMultiByte(CP_ACP, 0, lpOutputString, -1, NULL, 0,
                                      NULL, NULL))
        == 0)
    {
        ASSERT("failed to get wide chars length\n");
        SetLastError(ERROR_INTERNAL_ERROR);
        goto EXIT;
    }

    /* strLen includes the null terminator */
    if ((lpOutputStringA = (LPSTR) InternalMalloc((strLen * sizeof(CHAR)))) == NULL)
    {
        ERROR("Insufficient memory available !\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto EXIT;
    }

    if(! WideCharToMultiByte(CP_ACP, 0, lpOutputString, -1,
                             lpOutputStringA, strLen, NULL, NULL))
    {
        ASSERT("failed to convert wide chars to multibytes\n");
        SetLastError(ERROR_INTERNAL_ERROR);
        InternalFree(lpOutputStringA);
        goto EXIT;
    }

    OutputDebugStringA(lpOutputStringA);
    InternalFree(lpOutputStringA);

EXIT:
    LOGEXIT("OutputDebugStringW returns\n");
    PERF_EXIT(OutputDebugStringW);
}